

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprog.c
# Opt level: O0

void bribe_prog_cityguard(CHAR_DATA *mob,CHAR_DATA *ch,int amount)

{
  int in_EDX;
  char *in_stack_00000018;
  CHAR_DATA *in_stack_00000020;
  char *in_stack_00001370;
  CHAR_DATA *in_stack_00001378;
  char *in_stack_00002498;
  CHAR_DATA *in_stack_000024a0;
  char *in_stack_00006d50;
  CHAR_DATA *in_stack_00006d58;
  
  if (in_EDX < 100) {
    do_say(in_stack_00001378,in_stack_00001370);
    do_murder(in_stack_000024a0,in_stack_00002498);
  }
  else if (in_EDX < 5000) {
    do_say(in_stack_00001378,in_stack_00001370);
  }
  else {
    interpret(in_stack_00006d58,in_stack_00006d50);
    do_sleep(in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

void bribe_prog_cityguard(CHAR_DATA *mob, CHAR_DATA *ch, int amount)
{
	if (amount < 100)
	{
		do_say(mob, "You cheapskate!!!");
		do_murder(mob, ch->name);
	}
	else if (amount >= 5000)
	{
		interpret(mob, "wink");
		do_sleep(mob, "");
	}
	else
	{
		do_say(mob, "Trying to bribe me, eh? It'll cost ya more than that.");
	}
}